

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

bool docio_check_buffer(docio_handle *handle,bid_t bid,uint64_t sb_bmp_revnum)

{
  bool bVar1;
  
  _docio_read_through_buffer(handle,bid,handle->log_callback,true);
  bVar1 = _docio_check_buffer(handle,sb_bmp_revnum);
  return bVar1;
}

Assistant:

bool docio_check_buffer(struct docio_handle *handle,
                        bid_t bid,
                        uint64_t sb_bmp_revnum)
{
    err_log_callback *log_callback = handle->log_callback;
    _docio_read_through_buffer(handle, bid, log_callback, true);
    return _docio_check_buffer(handle, sb_bmp_revnum);
}